

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O2

void do_immtalk(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  char *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  uint uVar7;
  char *pcVar8;
  CHAR_DATA **ch_00;
  string_view fmt;
  format_args args;
  string buffer;
  char *local_2458 [2];
  char *local_2448;
  char buf2 [4608];
  char arg1 [4608];
  
  bVar2 = is_immortal(ch);
  if (bVar2) {
    if (*argument == '\0') {
      if ((ch->comm[0] & 4) == 0) {
        send_to_char("Immortal channel is now OFF\n\r",ch);
        *(byte *)ch->comm = (byte)ch->comm[0] | 4;
      }
      else {
        send_to_char("Immortal channel is now ON\n\r",ch);
        *(byte *)ch->comm = (byte)ch->comm[0] & 0xfb;
      }
    }
    else {
      pcVar8 = buf2;
      strcpy(pcVar8,argument);
      pcVar5 = one_argument(argument,arg1);
      if (arg1[0] != '\0') {
        bVar2 = is_number(arg1);
        uVar7 = 0x33;
        if (bVar2) {
          uVar3 = atoi(arg1);
          iVar4 = get_trust(ch);
          if ((0x32 < (int)uVar3) && ((int)uVar3 <= iVar4)) {
            strcpy(buf2,pcVar5);
            uVar7 = uVar3;
          }
        }
        if (buf2[0] != '\0') {
          if (uVar7 < 0x34) {
            this = ": {}";
            pcVar5 = (char *)0x4;
            sVar6 = 0xc;
            local_2458[0] = pcVar8;
          }
          else {
            local_2448 = buf2;
            this = " [{}]: {}";
            pcVar5 = (char *)0x9;
            sVar6 = 0xc1;
            local_2458[0] = (char *)(ulong)uVar7;
          }
          args.desc_ = local_2458;
          fmt.size_ = sVar6;
          fmt.data_ = pcVar5;
          args.field_1.args_ = in_R9.args_;
          ::fmt::v9::vformat_abi_cxx11_(&buffer,(v9 *)this,fmt,args);
          uVar1 = ch->comm[0];
          ch->comm[0] = uVar1 & 0xfffffffffffffffb;
          if (((uint)uVar1 >> 10 & 1) == 0) {
            pcVar8 = "[IMM] $n$t";
          }
          else {
            pcVar5 = get_char_color(ch,"immtalk");
            END_COLOR(ch);
            sprintf(pcVar8,"%s[IMM] $n$t%s",pcVar5);
          }
          act_new(pcVar8,ch,buffer._M_dataplus._M_p,(void *)0x0,3,0);
          uVar3 = 0x34;
          if (0x34 < uVar7) {
            uVar3 = uVar7;
          }
          ch_00 = &char_list;
          while (ch_00 = &((CHAR_DATA *)ch_00)->next->next, (CHAR_DATA *)ch_00 != (CHAR_DATA *)0x0)
          {
            bVar2 = is_npc((CHAR_DATA *)ch_00);
            if ((((!bVar2) || (((CHAR_DATA *)ch_00)->desc != (DESCRIPTOR_DATA *)0x0)) &&
                (((bVar2 = is_immortal((CHAR_DATA *)ch_00), bVar2 ||
                  ((((CHAR_DATA *)ch_00)->comm[0] & 0x40000) != 0)) ||
                 (((bVar2 = is_npc((CHAR_DATA *)ch_00), bVar2 &&
                   (((CHAR_DATA *)ch_00)->desc != (DESCRIPTOR_DATA *)0x0)) &&
                  (bVar2 = is_immortal(((CHAR_DATA *)ch_00)->desc->original), bVar2)))))) &&
               (iVar4 = get_trust((CHAR_DATA *)ch_00), (int)uVar3 <= iVar4)) {
              pcVar8 = "[IMM] $n$t";
              if ((((CHAR_DATA *)ch_00)->comm[0] & 0x400) != 0) {
                pcVar8 = get_char_color((CHAR_DATA *)ch_00,"immtalk");
                pcVar5 = END_COLOR((CHAR_DATA *)ch_00);
                sprintf(buf2,"%s[IMM] $n$t%s",pcVar8,pcVar5);
                pcVar8 = buf2;
              }
              act_new(pcVar8,ch,buffer._M_dataplus._M_p,ch_00,2,0);
            }
          }
          std::__cxx11::string::~string((string *)&buffer);
          return;
        }
      }
      send_to_char("Syntax: immtalk <level?> <message>\n\r",ch);
    }
  }
  return;
}

Assistant:

void do_immtalk(CHAR_DATA *ch, char *argument)
{
	if (!is_immortal(ch))
		return;

	if (argument[0] == '\0')
	{
		if (IS_SET(ch->comm, COMM_NOWIZ))
		{
			send_to_char("Immortal channel is now ON\n\r", ch);
			REMOVE_BIT(ch->comm, COMM_NOWIZ);
		}
		else
		{
			send_to_char("Immortal channel is now OFF\n\r", ch);
			SET_BIT(ch->comm, COMM_NOWIZ);
		}

		return;
	}

	char buf2[MAX_STRING_LENGTH];
	sprintf(buf2, "%s", argument);

	char arg1[MAX_STRING_LENGTH];
	argument = one_argument(argument, arg1);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: immtalk <level?> <message>\n\r", ch);
		return;
	}

	int level = 51;
	if (is_number(arg1))
	{
		level = atoi(arg1);
		if (level > get_trust(ch) || level < 51)
		{
			level = 51;
		}
		else
		{
			sprintf(buf2, "%s", argument);
		}
	}

	if (buf2[0] == '\0')
	{
		send_to_char("Syntax: immtalk <level?> <message>\n\r", ch);
		return;
	}

	auto buffer = level > LEVEL_HERO
		? fmt::format(" [{}]: {}", level, buf2)
		: fmt::format(": {}", buf2); //TODO: change the rest of the sprintf calls to format

	REMOVE_BIT(ch->comm, COMM_NOWIZ);

	if (IS_SET(ch->comm, COMM_ANSI))
	{
		sprintf(buf2, "%s[IMM] $n$t%s", get_char_color(ch, "immtalk"), END_COLOR(ch));
		act_new(buf2, ch, buffer.data(), 0, TO_CHAR, POS_DEAD);
	}
	else
	{
		act_new("[IMM] $n$t", ch, buffer.data(), 0, TO_CHAR, POS_DEAD);
	}

	for (auto wch = char_list; wch != nullptr; wch = wch->next)
	{
		if (is_npc(wch) && wch->desc == nullptr)
			continue;

		if ((is_immortal(wch) || IS_SET(wch->comm, COMM_IMMORTAL) || (is_npc(wch) && (wch->desc != nullptr) && is_immortal(wch->desc->original))) && get_trust(wch) >= std::max(level, 52))
		{
			if (IS_SET(wch->comm, COMM_ANSI))
			{
				sprintf(buf2, "%s[IMM] $n$t%s", get_char_color(wch, "immtalk"), END_COLOR(wch));
				act_new(buf2, ch, buffer.data(), wch, TO_VICT, POS_DEAD);
			}
			else
			{
				act_new("[IMM] $n$t", ch, buffer.data(), wch, TO_VICT, POS_DEAD);
			}
		}
	}
}